

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *in_RSI;
  int value;
  uint in_stack_ffffffffffffffe8;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    iVar2 = stbi__at_eof((stbi__context *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 & 0xffffff;
    if (iVar2 == 0) {
      iVar2 = stbi__pnm_isdigit(*in_RSI);
      in_stack_ffffffffffffffe8 = CONCAT13(iVar2 != 0,(int3)in_stack_ffffffffffffffe8);
    }
    if ((char)(in_stack_ffffffffffffffe8 >> 0x18) == '\0') break;
    iVar3 = iVar3 * 10 + (char)*in_RSI + -0x30;
    sVar1 = stbi__get8((stbi__context *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    *in_RSI = sVar1;
  }
  return iVar3;
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
   }

   return value;
}